

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

saint_t sufcheck(sauchar_t *T,saidx_t *SA,saidx_t n,saint_t verbose)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  saint_t c;
  saidx_t t;
  saidx_t q;
  saidx_t p;
  saidx_t i;
  saidx_t C [256];
  uint local_44c;
  uint local_43c;
  uint local_438;
  uint local_430;
  uint local_42c;
  uint auStack_428 [258];
  int local_20;
  int local_1c;
  long local_18;
  long local_10;
  saint_t local_4;
  
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_ECX != 0) {
    fprintf(_stderr,"sufcheck: ");
  }
  if (((local_10 == 0) || (local_18 == 0)) || (local_1c < 0)) {
    if (local_20 != 0) {
      fprintf(_stderr,"Invalid arguments.\n");
    }
    local_4 = -1;
  }
  else if (local_1c == 0) {
    if (local_20 != 0) {
      fprintf(_stderr,"Done.\n");
    }
    local_4 = 0;
  }
  else {
    for (local_42c = 0; (int)local_42c < local_1c; local_42c = local_42c + 1) {
      if ((*(int *)(local_18 + (long)(int)local_42c * 4) < 0) ||
         (local_1c <= *(int *)(local_18 + (long)(int)local_42c * 4))) {
        if (local_20 != 0) {
          fprintf(_stderr,"Out of the range [0,%d].\n  SA[%d]=%d\n",(ulong)(local_1c - 1),
                  (ulong)local_42c,(ulong)*(uint *)(local_18 + (long)(int)local_42c * 4));
        }
        return -2;
      }
    }
    for (local_42c = 1; (int)local_42c < local_1c; local_42c = local_42c + 1) {
      if (*(byte *)(local_10 + *(int *)(local_18 + (long)(int)local_42c * 4)) <
          *(byte *)(local_10 + *(int *)(local_18 + (long)(int)(local_42c - 1) * 4))) {
        if (local_20 != 0) {
          fprintf(_stderr,"Suffixes in wrong order.\n  T[SA[%d]=%d]=%d > T[SA[%d]=%d]=%d\n",
                  (ulong)(local_42c - 1),(ulong)*(uint *)(local_18 + (long)(int)(local_42c - 1) * 4)
                  ,(ulong)*(byte *)(local_10 + *(int *)(local_18 + (long)(int)(local_42c - 1) * 4)),
                  (ulong)local_42c,*(undefined4 *)(local_18 + (long)(int)local_42c * 4),
                  (uint)*(byte *)(local_10 + *(int *)(local_18 + (long)(int)local_42c * 4)));
        }
        return -3;
      }
    }
    for (local_42c = 0; (int)local_42c < 0x100; local_42c = local_42c + 1) {
      auStack_428[(int)local_42c] = 0;
    }
    for (local_42c = 0; (int)local_42c < local_1c; local_42c = local_42c + 1) {
      auStack_428[*(byte *)(local_10 + (int)local_42c)] =
           auStack_428[*(byte *)(local_10 + (int)local_42c)] + 1;
    }
    local_430 = 0;
    for (local_42c = 0; (int)local_42c < 0x100; local_42c = local_42c + 1) {
      uVar2 = auStack_428[(int)local_42c];
      auStack_428[(int)local_42c] = local_430;
      local_430 = uVar2 + local_430;
    }
    uVar2 = auStack_428[*(byte *)(local_10 + (local_1c + -1))];
    bVar1 = *(byte *)(local_10 + (local_1c + -1));
    auStack_428[bVar1] = auStack_428[bVar1] + 1;
    for (local_42c = 0; (int)local_42c < local_1c; local_42c = local_42c + 1) {
      iVar3 = *(int *)(local_18 + (long)(int)local_42c * 4);
      if (iVar3 < 1) {
        local_430 = local_1c + -1;
        local_43c = (uint)*(byte *)(local_10 + (int)local_430);
        local_438 = uVar2;
      }
      else {
        local_430 = iVar3 + -1;
        local_43c = (uint)*(byte *)(local_10 + (int)local_430);
        local_438 = auStack_428[(int)local_43c];
      }
      if (((int)local_438 < 0) || (local_430 != *(int *)(local_18 + (long)(int)local_438 * 4))) {
        if (local_20 != 0) {
          if ((int)local_438 < 0) {
            local_44c = 0xffffffff;
          }
          else {
            local_44c = *(uint *)(local_18 + (long)(int)local_438 * 4);
          }
          fprintf(_stderr,"Suffix in wrong position.\n  SA[%d]=%d or\n  SA[%d]=%d\n",
                  (ulong)local_438,(ulong)local_44c,(ulong)local_42c,
                  (ulong)*(uint *)(local_18 + (long)(int)local_42c * 4));
        }
        return -4;
      }
      if ((local_438 != uVar2) &&
         ((auStack_428[(int)local_43c] = auStack_428[(int)local_43c] + 1,
          local_1c <= (int)auStack_428[(int)local_43c] ||
          (*(byte *)(local_10 + *(int *)(local_18 + (long)(int)auStack_428[(int)local_43c] * 4)) !=
           local_43c)))) {
        auStack_428[(int)local_43c] = 0xffffffff;
      }
    }
    if (0 < local_20) {
      fprintf(_stderr,"Done.\n");
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

saint_t
sufcheck(const sauchar_t *T, const saidx_t *SA,
         saidx_t n, saint_t verbose) {
  saidx_t C[ALPHABET_SIZE];
  saidx_t i, p, q, t;
  saint_t c;

  if(verbose) { fprintf(stderr, "sufcheck: "); }

  /* Check arguments. */
  if((T == NULL) || (SA == NULL) || (n < 0)) {
    if(verbose) { fprintf(stderr, "Invalid arguments.\n"); }
    return -1;
  }
  if(n == 0) {
    if(verbose) { fprintf(stderr, "Done.\n"); }
    return 0;
  }

  /* check range: [0..n-1] */
  for(i = 0; i < n; ++i) {
    if((SA[i] < 0) || (n <= SA[i])) {
      if(verbose) {
        fprintf(stderr, "Out of the range [0,%" PRIdSAIDX_T "].\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "\n",
                        n - 1, i, SA[i]);
      }
      return -2;
    }
  }

  /* check first characters. */
  for(i = 1; i < n; ++i) {
    if(T[SA[i - 1]] > T[SA[i]]) {
      if(verbose) {
        fprintf(stderr, "Suffixes in wrong order.\n"
                        "  T[SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "]=%d"
                        " > T[SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "]=%d\n",
                        i - 1, SA[i - 1], T[SA[i - 1]], i, SA[i], T[SA[i]]);
      }
      return -3;
    }
  }

  /* check suffixes. */
  for(i = 0; i < ALPHABET_SIZE; ++i) { C[i] = 0; }
  for(i = 0; i < n; ++i) { ++C[T[i]]; }
  for(i = 0, p = 0; i < ALPHABET_SIZE; ++i) {
    t = C[i];
    C[i] = p;
    p += t;
  }

  q = C[T[n - 1]];
  C[T[n - 1]] += 1;
  for(i = 0; i < n; ++i) {
    p = SA[i];
    if(0 < p) {
      c = T[--p];
      t = C[c];
    } else {
      c = T[p = n - 1];
      t = q;
    }
    if((t < 0) || (p != SA[t])) {
      if(verbose) {
        fprintf(stderr, "Suffix in wrong position.\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T " or\n"
                        "  SA[%" PRIdSAIDX_T "]=%" PRIdSAIDX_T "\n",
                        t, (0 <= t) ? SA[t] : -1, i, SA[i]);
      }
      return -4;
    }
    if(t != q) {
      ++C[c];
      if((n <= C[c]) || (T[SA[C[c]]] != c)) { C[c] = -1; }
    }
  }

  if(1 <= verbose) { fprintf(stderr, "Done.\n"); }
  return 0;
}